

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_load.c
# Opt level: O0

ogl_StrToExtMap * FindExtEntry(char *extensionName)

{
  int iVar1;
  ogl_StrToExtMap *local_28;
  ogl_StrToExtMap *currLoc;
  int loop;
  char *extensionName_local;
  
  local_28 = ExtensionMap;
  currLoc._4_4_ = 0;
  while( true ) {
    if (g_extensionMapSize <= currLoc._4_4_) {
      return (ogl_StrToExtMap *)0x0;
    }
    iVar1 = strcmp(extensionName,local_28->extensionName);
    if (iVar1 == 0) break;
    currLoc._4_4_ = currLoc._4_4_ + 1;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

static ogl_StrToExtMap *FindExtEntry(const char *extensionName)
{
	int loop;
	ogl_StrToExtMap *currLoc = ExtensionMap;
	for(loop = 0; loop < g_extensionMapSize; ++loop, ++currLoc)
	{
		if(strcmp(extensionName, currLoc->extensionName) == 0)
			return currLoc;
	}
	
	return NULL;
}